

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _utils.c
# Opt level: O3

longlong bm_run_n(uint n,_func_void_varargs *test_fn)

{
  timespec ts_begin;
  timespec ts_end;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  
  timespec_get(&local_30,1);
  if (n != 0) {
    do {
      (*test_fn)();
      n = n - 1;
    } while (n != 0);
  }
  timespec_get(&local_20,1);
  return (local_18 - local_28) + (local_20 - local_30) * 1000000000;
}

Assistant:

long long bm_run_n(unsigned n, void (*test_fn)()) {
    struct timespec ts_begin;
    timespec_get(&ts_begin, TIME_UTC);

    for (unsigned i = 0; i < n; i++)
        test_fn();

    struct timespec ts_end;
    timespec_get(&ts_end, TIME_UTC);

    return (ts_end.tv_sec * 1000000000 + ts_end.tv_nsec) - (ts_begin.tv_sec * 1000000000 + ts_begin.tv_nsec);
}